

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_impl.hpp
# Opt level: O1

ostringstream * toml::detail::format_empty_line(ostringstream *oss,size_t lnw)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  if (lnw + 1 == 0) {
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_40,lnw + 1,' ');
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)oss,local_40._M_dataplus._M_p,local_40._M_string_length);
  if (color::ansi::detail::color_status()::status == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[01m",5);
  }
  if (color::ansi::detail::color_status()::status == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[34m",5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," |\n",3);
  if (color::ansi::detail::color_status()::status == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[00m",5);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return oss;
}

Assistant:

TOML11_INLINE std::ostringstream& format_empty_line(std::ostringstream& oss,
        const std::size_t lnw)
{
    //    |
    oss << detail::make_string(lnw + 1, ' ')
        << color::bold << color::blue << " |\n"  << color::reset;
    return oss;
}